

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

bool __thiscall axl::io::MappedFile::duplicate(MappedFile *this,Handle fileHandle,uint_t flags)

{
  bool bVar1;
  uint_t in_EDX;
  int in_ESI;
  MappedFile *in_RDI;
  bool result;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  close(in_RDI,in_ESI);
  bVar1 = File::duplicate((File *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                          (Handle)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    in_RDI->m_fileFlags = in_EDX;
  }
  return bVar1;
}

Assistant:

bool
MappedFile::duplicate(
	File::Handle fileHandle,
	uint_t flags
) {
	close();

	bool result = m_file.duplicate(fileHandle);
	if (!result)
		return false;

	m_fileFlags = flags;
	return true;
}